

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fc_layer.h
# Opt level: O1

void __thiscall fc_layer_t::fc_layer_t(fc_layer_t *this,tdsize in_size,int out_size)

{
  pointer pfVar1;
  pointer pgVar2;
  int iVar3;
  float *pfVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined1 local_a8 [16];
  pointer local_98;
  tensor_t<float> local_80;
  tensor_t<float> local_58;
  
  iVar7 = in_size.z;
  iVar5 = in_size.y;
  iVar6 = in_size.x;
  tensor_t<float>::tensor_t((tensor_t<float> *)local_a8,iVar6,iVar5,iVar7);
  tensor_t<float>::tensor_t(&local_80,iVar6,iVar5,iVar7);
  tensor_t<float>::tensor_t(&local_58,out_size,1,1);
  layer_t::layer_t(&this->super_layer_t,fc,(tensor_t<float> *)local_a8,&local_80,&local_58);
  if (local_58.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_80.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((pointer)local_a8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._0_8_);
  }
  (this->input).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->input).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->input).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar5 = iVar7 * iVar6 * iVar5;
  tensor_t<float>::tensor_t(&this->weights,iVar5,out_size,1);
  (this->gradients).super__Vector_base<gradient_t,_std::allocator<gradient_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->gradients).super__Vector_base<gradient_t,_std::allocator<gradient_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->gradients).super__Vector_base<gradient_t,_std::allocator<gradient_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_a8,(long)out_size,
             (allocator_type *)&local_80);
  (this->input).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = &local_98->grad;
  pfVar1 = (this->input).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->input).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_a8._0_8_;
  (this->input).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)local_a8._8_8_;
  local_a8 = ZEXT816(0) << 0x20;
  local_98 = (pointer)0x0;
  if (pfVar1 != (pointer)0x0) {
    operator_delete(pfVar1);
  }
  if ((pointer)local_a8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._0_8_);
  }
  std::vector<gradient_t,_std::allocator<gradient_t>_>::vector
            ((vector<gradient_t,_std::allocator<gradient_t>_> *)local_a8,(long)out_size,
             (allocator_type *)&local_80);
  (this->gradients).super__Vector_base<gradient_t,_std::allocator<gradient_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_98;
  pgVar2 = (this->gradients).super__Vector_base<gradient_t,_std::allocator<gradient_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->gradients).super__Vector_base<gradient_t,_std::allocator<gradient_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_a8._0_8_;
  (this->gradients).super__Vector_base<gradient_t,_std::allocator<gradient_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_a8._8_8_;
  local_a8 = ZEXT816(0) << 0x20;
  local_98 = (pointer)0x0;
  if (pgVar2 != (pointer)0x0) {
    operator_delete(pgVar2);
  }
  if ((pointer)local_a8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._0_8_);
  }
  if (0 < out_size) {
    iVar7 = 0;
    do {
      if (0 < iVar5) {
        iVar6 = 0;
        do {
          iVar3 = rand();
          pfVar4 = tensor_t<float>::get(&this->weights,iVar6,iVar7,0);
          *pfVar4 = (float)iVar3 * 1.0231603e-09 * (1.0 / (float)iVar5);
          iVar6 = iVar6 + 1;
        } while (iVar5 != iVar6);
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 != out_size);
  }
  return;
}

Assistant:

fc_layer_t(tdsize in_size, int out_size) :
      layer_t(layer_type::fc,
              tensor_t<float>(in_size.x, in_size.y, in_size.z),
              tensor_t<float>(in_size.x, in_size.y, in_size.z),
              tensor_t<float>(out_size, 1, 1)), weights(in_size.x * in_size.y * in_size.z, out_size, 1) {
    input = std::vector<float>(static_cast<unsigned long>(out_size));
    gradients = std::vector<gradient_t>(static_cast<unsigned long>(out_size));

    int maxval = in_size.x * in_size.y * in_size.z;

    // weight initialization
    for (int i = 0; i < out_size; i++)
      for (int h = 0; h < in_size.x * in_size.y * in_size.z; h++)
        weights(h, i, 0) = 2.19722f / maxval * rand() / float(RAND_MAX);
    // 2.19722f = f^-1(0.9) => x where [1 / (1 + exp(-x) ) = 0.9]
  }